

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_quaternion rf_quaternion_from_axis_angle(rf_vec3 axis,float angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  rf_quaternion rVar8;
  
  fVar4 = axis.z;
  fVar2 = axis.x;
  fVar3 = axis.y;
  fVar6 = fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3;
  fVar5 = SQRT(fVar6);
  fVar1 = fVar5;
  if (fVar6 < 0.0) {
    fVar1 = sqrtf(fVar6);
  }
  fVar1 = (float)(~-(uint)(fVar1 != 0.0) & (uint)angle | (uint)(angle * 0.5) & -(uint)(fVar1 != 0.0)
                 );
  if (fVar6 < 0.0) {
    fVar5 = sqrtf(fVar6);
  }
  fVar7 = (float)(-(uint)(fVar5 == 0.0) & 0x3f800000 | ~-(uint)(fVar5 == 0.0) & (uint)(1.0 / fVar5))
  ;
  fVar5 = sinf(fVar1);
  fVar1 = cosf(fVar1);
  fVar6 = fVar2 * fVar7 * fVar5;
  fVar2 = fVar3 * fVar7 * fVar5;
  fVar5 = fVar7 * fVar4 * fVar5;
  fVar3 = fVar1 * fVar1 + fVar5 * fVar5 + fVar6 * fVar6 + fVar2 * fVar2;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = (float)(-(uint)(fVar3 == 0.0) & 0x3f800000 | ~-(uint)(fVar3 == 0.0) & (uint)(1.0 / fVar3))
  ;
  rVar8.x = fVar6 * fVar3;
  rVar8.y = fVar2 * fVar3;
  rVar8.z = fVar5 * fVar3;
  rVar8.w = fVar1 * fVar3;
  return rVar8;
}

Assistant:

RF_API rf_quaternion rf_quaternion_from_axis_angle(rf_vec3 axis, float angle)
{
    rf_quaternion result = {0.0f, 0.0f, 0.0f, 1.0f};

    if (rf_vec3_len(axis) != 0.0f)

        angle *= 0.5f;

    axis = rf_vec3_normalize(axis);

    float sinres = sinf(angle);
    float cosres = cosf(angle);

    result.x = axis.x * sinres;
    result.y = axis.y * sinres;
    result.z = axis.z * sinres;
    result.w = cosres;

    result = rf_quaternion_normalize(result);

    return result;
}